

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O3

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getOriginalTemps_abi_cxx11_
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,AssemblyCommands *commands)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pcVar4;
  pointer pCVar5;
  pointer psVar6;
  pointer pCVar7;
  CTemp temp;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_88;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar6 = (commands->
           super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (commands->
           super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar2) {
    do {
      peVar3 = (psVar6->
               super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      this = (psVar6->super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>)
             ._M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      (*peVar3->_vptr_AssemblyCommand[1])(&local_88);
      pCVar5 = local_88.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar7 = local_88.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar7 != pCVar5; pCVar7 = pCVar7 + 1) {
        pcVar4 = (pCVar7->name)._M_dataplus._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar4,pcVar4 + (pCVar7->name)._M_string_length);
        IRT::CTemp::ToString_abi_cxx11_(&local_70,(CTemp *)local_50);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_88);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> getOriginalTemps(AssemblyCommands& commands) {
    std::set<std::string> temps;
    for (auto command : commands) {
        for (auto temp : command->GetOut()) {
            temps.insert(temp.ToString());
        }
    }

    return temps;
}